

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

CURLcode Curl_conn_connect(Curl_easy *data,int sockindex,_Bool blocking,_Bool *done)

{
  easy_pollset *ps_00;
  curl_trc_feat *pcVar1;
  connectdata *pcVar2;
  Curl_cft_cntrl *pCVar3;
  bool bVar4;
  _Bool _Var5;
  CURLcode CVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong timeout_ms;
  bool bVar10;
  uint sock;
  Curl_easy *data_00;
  Curl_cfilter *pCVar11;
  curltime cVar12;
  curl_pollfds cpfds;
  easy_pollset ps;
  pollfd a_few_on_stack [5];
  undefined1 local_90 [32];
  connectdata *pcStack_70;
  undefined8 local_68;
  Curl_llist *pCStack_60;
  pollfd local_58 [5];
  
  pCVar11 = data->conn->cfilter[sockindex];
  if (pCVar11 == (Curl_cfilter *)0x0) {
    *done = false;
    CVar6 = CURLE_FAILED_INIT;
  }
  else {
    CVar6 = CURLE_OK;
    _Var5 = (_Bool)(pCVar11->field_0x24 & 1);
    *done = _Var5;
    if (_Var5 == false) {
      Curl_pollfds_init((curl_pollfds *)local_90,local_58,5);
      CVar6 = CURLE_OK;
      if (*done == false) {
LAB_00118b21:
        _Var5 = Curl_conn_needs_flush(data,sockindex);
        if (((_Var5) && (CVar6 = Curl_conn_flush(data,sockindex), CVar6 != CURLE_AGAIN)) &&
           (CVar6 != CURLE_OK)) {
          return CVar6;
        }
        CVar6 = (*(code *)pCVar11->cft->do_connect)(pCVar11,data,done);
        if (((((data->set).field_0x89f & 0x40) != 0) &&
            ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)
             ))) && (0 < pCVar11->cft->log_level)) {
          Curl_trc_cf_infof(data,pCVar11,"Curl_conn_connect(block=%d) -> %d, done=%d",
                            (ulong)blocking,(ulong)CVar6,(ulong)*done);
        }
        if (CVar6 == CURLE_OK) {
          if (*done == true) {
            pcVar2 = data->conn;
            lVar9 = 0;
            bVar4 = true;
            do {
              bVar10 = bVar4;
              for (pCVar11 = pcVar2->cfilter[lVar9]; pCVar11 != (Curl_cfilter *)0x0;
                  pCVar11 = pCVar11->next) {
                pCVar3 = pCVar11->cft->cntrl;
                if (pCVar3 != Curl_cf_def_cntrl) {
                  (*pCVar3)(pCVar11,data,0x100,0,(void *)0x0);
                }
              }
              lVar9 = 1;
              bVar4 = false;
            } while (bVar10);
            conn_report_connect_stats(data,(connectdata *)data->conn->cfilter[0]);
            pcVar2 = data->conn;
            cVar12 = Curl_now();
            (pcVar2->keepalive).tv_sec = cVar12.tv_sec;
            (pcVar2->keepalive).tv_usec = cVar12.tv_usec;
            Curl_verboseconnect(data,data->conn,sockindex);
            CVar6 = CURLE_OK;
          }
          else {
            CVar6 = CURLE_OK;
            if (blocking) {
              uVar8 = Curl_timeleft(data,(curltime *)0x0,true);
              CVar6 = (*pCVar11->cft->query)(pCVar11,data,3,(int *)0x0,local_90 + 0x18);
              if ((long)uVar8 < 0) {
                Curl_failf(data,"connect timeout");
                CVar6 = CURLE_OPERATION_TIMEDOUT;
              }
              else {
                sock = -(uint)(CVar6 != CURLE_OK) | local_90._24_4_;
                if ((((data->set).field_0x89f & 0x40) != 0) &&
                   (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar1->log_level)) && (0 < pCVar11->cft->log_level)))) {
                  Curl_trc_cf_infof(data,pCVar11,"Curl_conn_connect(block=1), do poll");
                }
                data_00 = (Curl_easy *)local_90;
                Curl_pollfds_reset((curl_pollfds *)data_00);
                local_68._0_4_ = MSTATE_INIT;
                local_68._4_4_ = CURLE_OK;
                pCStack_60 = (Curl_llist *)0x0;
                local_90._24_8_ = (multi_sub_xfer_done_cb *)0x0;
                pcStack_70 = (connectdata *)0x0;
                ps_00 = (easy_pollset *)(local_90 + 0x18);
                if (sock != 0xffffffff) {
                  Curl_pollset_change(data_00,ps_00,sock,2,1);
                }
                pcVar2 = data->conn;
                Curl_conn_cf_adjust_pollset(pcVar2->cfilter[0],data,ps_00);
                Curl_conn_cf_adjust_pollset(pcVar2->cfilter[1],data,ps_00);
                CVar6 = Curl_pollfds_add_ps((curl_pollfds *)local_90,ps_00);
                if (CVar6 == CURLE_OK) {
                  timeout_ms = 1000;
                  if (local_90._8_4_ == 0) {
                    timeout_ms = 10;
                  }
                  if (uVar8 < timeout_ms) {
                    timeout_ms = uVar8;
                  }
                  iVar7 = Curl_poll((pollfd *)local_90._0_8_,local_90._8_4_,timeout_ms);
                  if (((((data->set).field_0x89f & 0x40) != 0) &&
                      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                       (0 < pcVar1->log_level)))) && (0 < pCVar11->cft->log_level)) {
                    Curl_trc_cf_infof(data,pCVar11,"Curl_conn_connect(block=1), Curl_poll() -> %d");
                  }
                  if (-1 < iVar7) goto code_r0x00118d16;
                  CVar6 = CURLE_COULDNT_CONNECT;
                }
              }
            }
          }
        }
        else {
          if (((((data->set).field_0x89f & 0x40) != 0) &&
              ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
               (0 < pcVar1->log_level)))) && (0 < pCVar11->cft->log_level)) {
            Curl_trc_cf_infof(data,pCVar11,"Curl_conn_connect(), filter returned %d",(ulong)CVar6);
          }
          conn_report_connect_stats(data,(connectdata *)data->conn->cfilter[0]);
        }
      }
LAB_00118ae2:
      Curl_pollfds_cleanup((curl_pollfds *)local_90);
    }
  }
  return CVar6;
code_r0x00118d16:
  CVar6 = CURLE_OK;
  if (*done == true) goto LAB_00118ae2;
  goto LAB_00118b21;
}

Assistant:

CURLcode Curl_conn_connect(struct Curl_easy *data,
                           int sockindex,
                           bool blocking,
                           bool *done)
{
#define CF_CONN_NUM_POLLS_ON_STACK 5
  struct pollfd a_few_on_stack[CF_CONN_NUM_POLLS_ON_STACK];
  struct curl_pollfds cpfds;
  struct Curl_cfilter *cf;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);

  cf = data->conn->cfilter[sockindex];
  if(!cf) {
    *done = FALSE;
    return CURLE_FAILED_INIT;
  }

  *done = cf->connected;
  if(*done)
    return CURLE_OK;

  Curl_pollfds_init(&cpfds, a_few_on_stack, CF_CONN_NUM_POLLS_ON_STACK);
  while(!*done) {
    if(Curl_conn_needs_flush(data, sockindex)) {
      DEBUGF(infof(data, "Curl_conn_connect(index=%d), flush", sockindex));
      result = Curl_conn_flush(data, sockindex);
      if(result && (result != CURLE_AGAIN))
        return result;
    }

    result = cf->cft->do_connect(cf, data, done);
    CURL_TRC_CF(data, cf, "Curl_conn_connect(block=%d) -> %d, done=%d",
                blocking, result, *done);
    if(!result && *done) {
      /* Now that the complete filter chain is connected, let all filters
       * persist information at the connection. E.g. cf-socket sets the
       * socket and ip related information. */
      cf_cntrl_update_info(data, data->conn);
      conn_report_connect_stats(data, data->conn);
      data->conn->keepalive = Curl_now();
      Curl_verboseconnect(data, data->conn, sockindex);
      goto out;
    }
    else if(result) {
      CURL_TRC_CF(data, cf, "Curl_conn_connect(), filter returned %d",
                  result);
      conn_report_connect_stats(data, data->conn);
      goto out;
    }

    if(!blocking)
      goto out;
    else {
      /* check allowed time left */
      const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);
      curl_socket_t sockfd = Curl_conn_cf_get_socket(cf, data);
      struct easy_pollset ps;
      int rc;

      if(timeout_ms < 0) {
        /* no need to continue if time already is up */
        failf(data, "connect timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }

      CURL_TRC_CF(data, cf, "Curl_conn_connect(block=1), do poll");
      Curl_pollfds_reset(&cpfds);
      memset(&ps, 0, sizeof(ps));
      /* In general, we want to send after connect, wait on that. */
      if(sockfd != CURL_SOCKET_BAD)
        Curl_pollset_set_out_only(data, &ps, sockfd);
      Curl_conn_adjust_pollset(data, data->conn, &ps);
      result = Curl_pollfds_add_ps(&cpfds, &ps);
      if(result)
        goto out;

      rc = Curl_poll(cpfds.pfds, cpfds.n,
                     CURLMIN(timeout_ms, (cpfds.n ? 1000 : 10)));
      CURL_TRC_CF(data, cf, "Curl_conn_connect(block=1), Curl_poll() -> %d",
                  rc);
      if(rc < 0) {
        result = CURLE_COULDNT_CONNECT;
        goto out;
      }
      /* continue iterating */
    }
  }

out:
  Curl_pollfds_cleanup(&cpfds);
  return result;
}